

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case3501(DeclarationBinderTester *this)

{
  initializer_list<int> __l;
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<int> *this_00;
  allocator<int> local_39d;
  int local_39c;
  iterator local_398;
  size_type local_390;
  vector<int,_std::allocator<int>_> local_388;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"void f() { int x ; }",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Object(&local_348,&local_368,VariableDeclaration,Block);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_280,pDVar1);
  pEVar2 = Expectation::declaration(&local_1b8,&local_280);
  local_39c = 0;
  local_398 = &local_39c;
  local_390 = 1;
  this_00 = &local_39d;
  std::allocator<int>::allocator(this_00);
  __l._M_len = local_390;
  __l._M_array = local_398;
  std::vector<int,_std::allocator<int>_>::vector(&local_388,__l,this_00);
  __len = (socklen_t)this_00;
  pEVar2 = Expectation::scopePath(pEVar2,&local_388);
  Expectation::Expectation(&local_100,pEVar2);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  std::vector<int,_std::allocator<int>_>::~vector(&local_388);
  std::allocator<int>::~allocator(&local_39d);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case3501()
{
    bind("void f() { int x ; }",
         Expectation()
            .declaration(Decl()
                     .Object("x", SymbolKind::VariableDeclaration, ScopeKind::Block)
                     .ty_.Basic(BasicTypeKind::Int_S))
            .scopePath({0}));
}